

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O3

QRect __thiscall QTreeWidget::visualItemRect(QTreeWidget *this,QTreeWidgetItem *item)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  char *__s;
  QHeaderView *pQVar4;
  QHeaderView *pQVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  QRect QVar7;
  QRect local_b8;
  QRect local_a8;
  undefined1 *local_98;
  undefined1 *puStack_90;
  QTreeWidgetItem *local_88;
  undefined1 *local_78;
  undefined1 *puStack_70;
  QTreeWidgetItem *local_68;
  undefined8 local_58;
  undefined1 *puStack_50;
  QTreeWidgetItem *local_48;
  Data *local_38;
  
  local_38 = *(Data **)(in_FS_OFFSET + 0x28);
  local_48 = (QTreeWidgetItem *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  __s = (char *)QMetaObject::cast((QObject *)&QTreeModel::staticMetaObject);
  QTreeModel::index((QTreeModel *)&local_58,__s,(int)item);
  pQVar4 = QTreeView::header(&this->super_QTreeView);
  pQVar5 = QTreeView::header(&this->super_QTreeView);
  iVar1 = QHeaderView::offset(pQVar5);
  uVar2 = QHeaderView::logicalIndexAt(pQVar4,-iVar1);
  pQVar4 = QTreeView::header(&this->super_QTreeView);
  pQVar5 = QTreeView::header(&this->super_QTreeView);
  iVar1 = QHeaderView::length(pQVar5);
  pQVar5 = QTreeView::header(&this->super_QTreeView);
  uVar3 = QHeaderView::offset(pQVar5);
  uVar3 = QHeaderView::logicalIndexAt(pQVar4,iVar1 + ~uVar3);
  local_68 = (QTreeWidgetItem *)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  if (local_48 == (QTreeWidgetItem *)0x0) {
    local_78 = (undefined1 *)0xffffffffffffffff;
    puStack_70 = (undefined1 *)0x0;
    local_68 = (QTreeWidgetItem *)0x0;
LAB_005b3c3d:
    local_98 = (undefined1 *)0xffffffffffffffff;
    puStack_90 = (undefined1 *)0x0;
    local_88 = (QTreeWidgetItem *)0x0;
  }
  else {
    uVar6 = (ulong)local_58 & 0xffffffff;
    if (local_58._4_4_ == uVar2) {
      local_68 = local_48;
      local_78 = local_58;
      puStack_70 = puStack_50;
    }
    else {
      (*local_48->_vptr_QTreeWidgetItem[0xe])(&local_78,local_48,uVar6,(ulong)uVar2,&local_58);
      uVar6 = (ulong)local_58 & 0xffffffff;
      if (local_48 == (QTreeWidgetItem *)0x0) goto LAB_005b3c3d;
    }
    local_88 = (QTreeWidgetItem *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    if (local_58._4_4_ == uVar3) {
      local_88 = local_48;
      local_98 = local_58;
      puStack_90 = puStack_50;
    }
    else {
      (*local_48->_vptr_QTreeWidgetItem[0xe])(&local_98,local_48,uVar6,(ulong)uVar3,&local_58);
    }
  }
  local_a8 = (QRect)(**(code **)(*(long *)&(this->super_QTreeView).super_QAbstractItemView.
                                           super_QAbstractScrollArea.super_QFrame.super_QWidget +
                                0x1e0))(this,&local_78);
  local_b8 = (QRect)(**(code **)(*(long *)&(this->super_QTreeView).super_QAbstractItemView.
                                           super_QAbstractScrollArea.super_QFrame.super_QWidget +
                                0x1e0))(this,&local_98);
  QVar7 = (QRect)QRect::operator|(&local_a8,&local_b8);
  if (*(Data **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return QVar7;
}

Assistant:

QRect QTreeWidget::visualItemRect(const QTreeWidgetItem *item) const
{
    Q_D(const QTreeWidget);
    //the visual rect for an item is across all columns. So we need to determine
    //what is the first and last column and get their visual index rects
    const QModelIndex base = d->index(item);
    const int firstVisiblesection = header()->logicalIndexAt(- header()->offset());
    const int lastVisibleSection = header()->logicalIndexAt(header()->length() - header()->offset() - 1);
    const QModelIndex first = base.sibling(base.row(), firstVisiblesection);
    const QModelIndex last = base.sibling(base.row(), lastVisibleSection);
    return visualRect(first) | visualRect(last);
}